

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralMiniIndex.hpp
# Opt level: O2

bool __thiscall Indexing::LiteralMiniIndex::InstanceIterator::hasNext(InstanceIterator *this)

{
  bool bVar1;
  Entry *pEVar2;
  
  bVar1 = true;
  if ((this->super_IteratorBase)._ready == false) {
    pEVar2 = (this->super_IteratorBase)._curr;
    while (pEVar2->_header == (this->super_IteratorBase)._hdr) {
      bVar1 = Kernel::MatchingUtils::match
                        ((this->super_IteratorBase)._query,pEVar2->_lit,
                         (this->super_IteratorBase)._compl);
      if (bVar1) {
        (this->super_IteratorBase)._ready = true;
        return true;
      }
      pEVar2 = (this->super_IteratorBase)._curr + 1;
      (this->super_IteratorBase)._curr = pEVar2;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool hasNext()
    {
      if(_ready) { return true; }
      while(_curr->_header==_hdr) {
        if(MatchingUtils::match(_query, _curr->_lit, _compl)) {
          _ready=true;
          return true;
        }
        _curr++;
      }
      return false;
    }